

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *cur,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
              out)

{
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  __result;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  reference pcVar4;
  size_type sVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_RDI;
  size_t sub;
  size_t i;
  string_type name;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe90;
  int iVar6;
  source_location *in_stack_fffffffffffffe98;
  regex_error *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  regex_error *in_stack_fffffffffffffeb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  size_type sVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  error_type in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  size_type local_78;
  allocator<char> local_59;
  char *local_58;
  char *local_50;
  string local_48 [32];
  char *local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  __last._M_current = &stack0x00000008;
  local_18 = in_RDX;
  bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (bVar1) {
    local_20 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffe98,
                            (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_20);
  }
  detail::ensure_((bool)in_stack_ffffffffffffff27,in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                  (unsigned_long)in_stack_ffffffffffffff00);
  local_28 = local_18->_M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    bVar1 = false;
    if (bVar2) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      bVar1 = *pcVar4 != '>';
    }
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_18);
  }
  bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if ((bVar1) &&
     (bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88), bVar1)) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(local_18);
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  detail::ensure_((bool)in_stack_ffffffffffffff27,in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                  (unsigned_long)in_stack_ffffffffffffff00);
  local_50 = local_28;
  local_58 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffffe98,iVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (allocator<char> *)in_stack_fffffffffffffea8);
  std::allocator<char>::~allocator(&local_59);
  local_78 = 0;
  while( true ) {
    sVar7 = local_78;
    sVar5 = std::
            vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
            ::size((vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
                    *)(in_RSI._M_current + 0xb8));
    if (sVar5 <= sVar7) {
      regex_error::regex_error
                (in_stack_fffffffffffffeb0,(error_type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (char *)in_stack_fffffffffffffea0);
      source_location::source_location
                ((source_location *)&stack0xffffffffffffff00,
                 "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                 ,0x541,
                 "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                 ,0);
      throw_exception<boost::xpressive::regex_error>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    std::
    vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ::operator[]((vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
                  *)(in_RSI._M_current + 0xb8),local_78);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (_Var3) break;
    local_78 = local_78 + 1;
  }
  std::
  vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ::operator[]((vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
                *)(in_RSI._M_current + 0xb8),local_78);
  detail::
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  detail::
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  __result.traits_ = (traits<char> *)in_stack_ffffffffffffff08;
  __result.out_.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       in_stack_ffffffffffffff00;
  __result._16_8_ = in_stack_ffffffffffffff10;
  std::
  copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
            (in_RSI,__last,__result);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

OutputIterator format_named_backref_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        BOOST_XPR_ENSURE_(cur != end && BOOST_XPR_CHAR_(char_type, '<') == *cur++
            , error_badmark, "invalid named back-reference");
        ForwardIterator begin = cur;
        for(; cur != end && BOOST_XPR_CHAR_(char_type, '>') != *cur; ++cur)
        {}
        BOOST_XPR_ENSURE_(cur != begin && cur != end && BOOST_XPR_CHAR_(char_type, '>') == *cur
            , error_badmark, "invalid named back-reference");

        string_type name(begin, cur++);
        for(std::size_t i = 0; i < this->named_marks_.size(); ++i)
        {
            if(this->named_marks_[i].name_ == name)
            {
                std::size_t sub = this->named_marks_[i].mark_nbr_;
                return std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
        }

        BOOST_THROW_EXCEPTION(regex_error(error_badmark, "invalid named back-reference"));
        // Should never get here
        return out;
    }